

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O0

void Cnf_DataWriteIntoFileGz
               (Cnf_Dat_t *p,char *pFileName,int fReadable,Vec_Int_t *vForAlls,Vec_Int_t *vExists)

{
  int *piVar1;
  int iVar2;
  gzFile file;
  uint local_8c;
  uint local_7c;
  uint local_64;
  int local_4c;
  int VarId;
  int i;
  int *pStop;
  int *pLit;
  gzFile pFile;
  Vec_Int_t *vExists_local;
  Vec_Int_t *vForAlls_local;
  int fReadable_local;
  char *pFileName_local;
  Cnf_Dat_t *p_local;
  
  file = gzopen(pFileName,"wb");
  if (file == (gzFile)0x0) {
    printf("Cnf_WriteIntoFile(): Output file cannot be opened.\n");
  }
  else {
    gzprintf(file,"c Result of efficient AIG-to-CNF conversion using package CNF\n");
    gzprintf(file,"p cnf %d %d\n",(ulong)(uint)p->nVars,(ulong)(uint)p->nClauses);
    if (vForAlls != (Vec_Int_t *)0x0) {
      gzprintf(file,"a ");
      for (local_4c = 0; iVar2 = Vec_IntSize(vForAlls), local_4c < iVar2; local_4c = local_4c + 1) {
        local_64 = Vec_IntEntry(vForAlls,local_4c);
        if (fReadable == 0) {
          local_64 = local_64 + 1;
        }
        gzprintf(file,"%d ",(ulong)local_64);
      }
      gzprintf(file,"0\n");
    }
    if (vExists != (Vec_Int_t *)0x0) {
      gzprintf(file,"e ");
      for (local_4c = 0; iVar2 = Vec_IntSize(vExists), local_4c < iVar2; local_4c = local_4c + 1) {
        local_7c = Vec_IntEntry(vExists,local_4c);
        if (fReadable == 0) {
          local_7c = local_7c + 1;
        }
        gzprintf(file,"%d ",(ulong)local_7c);
      }
      gzprintf(file,"0\n");
    }
    for (local_4c = 0; local_4c < p->nClauses; local_4c = local_4c + 1) {
      piVar1 = p->pClauses[local_4c + 1];
      for (pStop = p->pClauses[local_4c]; pStop < piVar1; pStop = pStop + 1) {
        if (fReadable == 0) {
          local_8c = Cnf_Lit2Var(*pStop);
        }
        else {
          local_8c = Cnf_Lit2Var2(*pStop);
        }
        gzprintf(file,"%d ",(ulong)local_8c);
      }
      gzprintf(file,"0\n");
    }
    gzprintf(file,"\n");
    gzclose(file);
  }
  return;
}

Assistant:

void Cnf_DataWriteIntoFileGz( Cnf_Dat_t * p, char * pFileName, int fReadable, Vec_Int_t * vForAlls, Vec_Int_t * vExists )
{
    gzFile pFile;
    int * pLit, * pStop, i, VarId;
    pFile = gzopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cnf_WriteIntoFile(): Output file cannot be opened.\n" );
        return;
    }
    gzprintf( pFile, "c Result of efficient AIG-to-CNF conversion using package CNF\n" );
    gzprintf( pFile, "p cnf %d %d\n", p->nVars, p->nClauses );
    if ( vForAlls )
    {
        gzprintf( pFile, "a " );
        Vec_IntForEachEntry( vForAlls, VarId, i )
            gzprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        gzprintf( pFile, "0\n" );
    }
    if ( vExists )
    {
        gzprintf( pFile, "e " );
        Vec_IntForEachEntry( vExists, VarId, i )
            gzprintf( pFile, "%d ", fReadable? VarId : VarId+1 );
        gzprintf( pFile, "0\n" );
    }
    for ( i = 0; i < p->nClauses; i++ )
    {
        for ( pLit = p->pClauses[i], pStop = p->pClauses[i+1]; pLit < pStop; pLit++ )
            gzprintf( pFile, "%d ", fReadable? Cnf_Lit2Var2(*pLit) : Cnf_Lit2Var(*pLit) );
        gzprintf( pFile, "0\n" );
    }
    gzprintf( pFile, "\n" );
    gzclose( pFile );
}